

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Image>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  VkDeviceSize objectDeviceMemorySize;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  deUint64 *pdVar9;
  long *plVar10;
  Parameters *in_RCX;
  Parameters *params_00;
  ulong uVar11;
  size_type __n;
  long lVar12;
  bool bVar13;
  Unique<vk::Handle<(vk::HandleType)9>_> image;
  Unique<vk::Handle<(vk::HandleType)9>_> obj;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Environment local_2b0;
  VkImage local_278;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_270;
  VkImage local_258;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_250;
  Environment local_230;
  Move<vk::Handle<(vk::HandleType)9>_> local_1f8;
  VkMemoryRequirements local_1d0;
  undefined1 local_1b8 [8];
  VkAllocationCallbacks aVStack_1b0 [2];
  ios_base local_140 [272];
  
  local_230.vkp = *(PlatformInterface **)(this + 8);
  local_230.vkd = Context::getDeviceInterface((Context *)this);
  local_230.device = Context::getDevice((Context *)this);
  local_230.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_230.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_230.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_230.maxResourceConsumers = 1;
  Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)local_1b8,&local_230,(Resources *)&params,
                in_RCX);
  DStack_270.m_device = (VkDevice)aVStack_1b0[0].pfnAllocation;
  DStack_270.m_allocator = (VkAllocationCallbacks *)aVStack_1b0[0].pfnReallocation;
  local_278.m_internal = (deUint64)local_1b8;
  DStack_270.m_deviceIface = (DeviceInterface *)aVStack_1b0[0].pUserData;
  ::vk::getImageMemoryRequirements(&local_1d0,local_230.vkd,local_230.device,(VkImage)local_1b8);
  objectDeviceMemorySize = getPageTableSize((Context *)this,local_1d0.size);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8,allocator,0x400);
  pPVar2 = *(PlatformInterface **)(this + 8);
  pDVar4 = Context::getDeviceInterface((Context *)this);
  pVVar5 = Context::getDevice((Context *)this);
  local_2b0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  params_00 = *(Parameters **)(this + 0x10);
  local_2b0.maxResourceConsumers = 1;
  local_2b0.vkp = pPVar2;
  local_2b0.vkd = pDVar4;
  local_2b0.device = pVVar5;
  local_2b0.programBinaries = (BinaryCollection *)params_00;
  local_2b0.allocationCallbacks = aVStack_1b0;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  Image::create(&local_1f8,&local_2b0,(Resources *)&params,params_00);
  DStack_250.m_device =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  DStack_250.m_allocator =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_258.m_internal =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  DStack_250.m_deviceIface =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_250,local_258);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8);
  sVar6 = getSafeObjectCount((Context *)this,sVar7 - sVar6,objectDeviceMemorySize);
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_270,local_278);
  }
  __n = 0x4000;
  if (sVar6 < 0x4000) {
    __n = sVar6;
  }
  local_2b0.vkp = *(PlatformInterface **)(this + 8);
  local_2b0.vkd = Context::getDeviceInterface((Context *)this);
  local_2b0.device = Context::getDevice((Context *)this);
  local_2b0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_2b0.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_2b0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_2b0.maxResourceConsumers = (deUint32)__n;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
            *)&local_230,__n,(allocator_type *)local_1b8);
  local_1b8 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)9>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)((DeviceInterface *)((long)aVStack_1b0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface + (int)aVStack_1b0);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (sVar6 != 0) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      pdVar9 = (deUint64 *)operator_new(0x20);
      Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)local_1b8,&local_2b0,
                    (Resources *)&params,params_00);
      pdVar9[2] = (deUint64)aVStack_1b0[0].pfnAllocation;
      pdVar9[3] = (deUint64)aVStack_1b0[0].pfnReallocation;
      *pdVar9 = (deUint64)local_1b8;
      pdVar9[1] = (deUint64)aVStack_1b0[0].pUserData;
      local_1b8 = (undefined1  [8])0x0;
      aVStack_1b0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1b0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1b0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar10 = (long *)operator_new(0x20);
      pPVar2 = local_230.vkp;
      *(undefined4 *)(plVar10 + 1) = 0;
      *(undefined4 *)((long)plVar10 + 0xc) = 0;
      *plVar10 = (long)&PTR__SharedPtrState_00d1de50;
      plVar10[2] = (long)pdVar9;
      *(undefined4 *)(plVar10 + 1) = 1;
      *(undefined4 *)((long)plVar10 + 0xc) = 1;
      plVar3 = *(long **)((long)&(local_230.vkp)->_vptr_PlatformInterface + lVar12);
      if (plVar3 != plVar10) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)((long)local_230.vkp + lVar12 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_230.vkp)->_vptr_PlatformInterface + lVar12) +
                        0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pPVar2->_vptr_PlatformInterface + lVar12) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)&pPVar2->_vptr_PlatformInterface + lVar12);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pPVar2->_vptr_PlatformInterface + lVar12) = 0;
          }
        }
        *(deUint64 **)((long)pPVar2 + lVar12 + -8) = pdVar9;
        *(long **)((long)&pPVar2->_vptr_PlatformInterface + lVar12) = plVar10;
        LOCK();
        *(int *)(plVar10 + 1) = (int)plVar10[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pPVar2->_vptr_PlatformInterface + lVar12) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar10 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar10 + 0x10))(plVar10);
      }
      LOCK();
      piVar1 = (int *)((long)plVar10 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)aVStack_1b0,(VkImage)local_1b8);
      }
      bVar13 = (uVar11 & 0x3ff) != 0;
      params_00 = (Parameters *)CONCAT71((int7)((ulong)params_00 >> 8),bVar13 || uVar11 == 0);
      if (!bVar13 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                     *)&local_230,(pointer)local_230.vkp);
  local_1b8 = (undefined1  [8])&aVStack_1b0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b8,
             (undefined1 *)((long)(_func_int ***)aVStack_1b0[0].pUserData + (long)local_1b8));
  if (local_1b8 != (undefined1  [8])&aVStack_1b0[0].pfnAllocation) {
    operator_delete((void *)local_1b8,(ulong)(aVStack_1b0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
             *)&local_230);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}